

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::GlobalPooling3DLayerParams::ByteSizeLong(GlobalPooling3DLayerParams *this)

{
  size_t sVar1;
  
  if (this->type_ == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->type_);
    sVar1 = sVar1 + 1;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t GlobalPooling3DLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GlobalPooling3DLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.GlobalPooling3DLayerParams.GlobalPoolingType3D type = 1;
  if (this->type() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}